

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.h
# Opt level: O0

bool __thiscall
google::protobuf::compiler::objectivec::FieldGenerator::needs_textformat_name_support
          (FieldGenerator *this)

{
  long lVar1;
  string local_38;
  string *local_18;
  string *field_flags;
  FieldGenerator *this_local;
  
  field_flags = (string *)this;
  variable_abi_cxx11_(&local_38,this,"fieldflags");
  local_18 = &local_38;
  lVar1 = std::__cxx11::string::find((char *)local_18,0x5f7100);
  std::__cxx11::string::~string((string *)&local_38);
  return lVar1 != -1;
}

Assistant:

bool needs_textformat_name_support() const {
    const string& field_flags = variable("fieldflags");
    return field_flags.find("GPBFieldTextFormatNameCustom") != string::npos;
  }